

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t HUF_readStats(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                    U32 *tableLogPtr,void *src,size_t srcSize)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  size_t sVar8;
  FSE_DTable fseWorkspace [65];
  
  sVar8 = 0xffffffffffffffb8;
  if (srcSize != 0) {
    uVar6 = (ulong)*src;
    sVar8 = 0xffffffffffffffec;
    if ((char)*src < '\0') {
      uVar4 = uVar6 - 0x7e >> 1;
      if (srcSize <= uVar4) {
        return 0xffffffffffffffb8;
      }
      uVar1 = uVar6 - 0x7f;
      if (hwSize <= uVar1) {
        return 0xffffffffffffffec;
      }
      pbVar7 = (byte *)((long)src + 1);
      for (lVar2 = 0; (uint)lVar2 < (uint)uVar1; lVar2 = lVar2 + 2) {
        huffWeight[lVar2] = *pbVar7 >> 4;
        huffWeight[lVar2 + 1] = *pbVar7 & 0xf;
        pbVar7 = pbVar7 + 1;
      }
    }
    else {
      if (srcSize <= uVar6) {
        return 0xffffffffffffffb8;
      }
      uVar1 = FSE_decompress_wksp(huffWeight,hwSize - 1,(void *)((long)src + 1),uVar6,fseWorkspace,6
                                 );
      uVar4 = uVar6;
      if (0xffffffffffffff88 < uVar1) {
        return uVar1;
      }
    }
    rankStats[8] = 0;
    rankStats[9] = 0;
    rankStats[10] = 0;
    rankStats[0xb] = 0;
    rankStats[4] = 0;
    rankStats[5] = 0;
    rankStats[6] = 0;
    rankStats[7] = 0;
    rankStats[0xc] = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    rankStats[2] = 0;
    rankStats[3] = 0;
    uVar5 = 0;
    for (uVar3 = 0; uVar6 = (ulong)uVar3, uVar6 < uVar1; uVar3 = uVar3 + 1) {
      if (0xb < (ulong)huffWeight[uVar6]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar6]] = rankStats[huffWeight[uVar6]] + 1;
      uVar5 = uVar5 + ((1 << (huffWeight[uVar6] & 0x1f)) >> 1);
    }
    if (uVar5 != 0) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      if (uVar3 < 0xc) {
        *tableLogPtr = 0x20 - (uVar3 ^ 0x1f);
        uVar5 = (2 << ((byte)uVar3 & 0x1f)) - uVar5;
        uVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if (1 << ((byte)uVar3 & 0x1f) == uVar5) {
          uVar3 = 0x20 - (uVar3 ^ 0x1f);
          huffWeight[uVar1] = (BYTE)uVar3;
          rankStats[uVar3] = rankStats[uVar3] + 1;
          if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
            *nbSymbolsPtr = (int)uVar1 + 1;
            sVar8 = uVar4 + 1;
          }
        }
      }
    }
  }
  return sVar8;
}

Assistant:

size_t HUF_readStats(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize)
{
    U32 weightTotal;
    const BYTE* ip = (const BYTE*) src;
    size_t iSize;
    size_t oSize;

    if (!srcSize) return ERROR(srcSize_wrong);
    iSize = ip[0];
    /* memset(huffWeight, 0, hwSize);   *//* is not necessary, even though some analyzer complain ... */

    if (iSize >= 128) {  /* special header */
        oSize = iSize - 127;
        iSize = ((oSize+1)/2);
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        if (oSize >= hwSize) return ERROR(corruption_detected);
        ip += 1;
        {   U32 n;
            for (n=0; n<oSize; n+=2) {
                huffWeight[n]   = ip[n/2] >> 4;
                huffWeight[n+1] = ip[n/2] & 15;
    }   }   }
    else  {   /* header compressed with FSE (normal case) */
        FSE_DTable fseWorkspace[FSE_DTABLE_SIZE_U32(6)];  /* 6 is max possible tableLog for HUF header (maybe even 5, to be tested) */
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        oSize = FSE_decompress_wksp(huffWeight, hwSize-1, ip+1, iSize, fseWorkspace, 6);   /* max (hwSize-1) values decoded, as last one is implied */
        if (FSE_isError(oSize)) return oSize;
    }

    /* collect weight stats */
    memset(rankStats, 0, (HUF_TABLELOG_MAX + 1) * sizeof(U32));
    weightTotal = 0;
    {   U32 n; for (n=0; n<oSize; n++) {
            if (huffWeight[n] >= HUF_TABLELOG_MAX) return ERROR(corruption_detected);
            rankStats[huffWeight[n]]++;
            weightTotal += (1 << huffWeight[n]) >> 1;
    }   }
    if (weightTotal == 0) return ERROR(corruption_detected);

    /* get last non-null symbol weight (implied, total must be 2^n) */
    {   U32 const tableLog = BIT_highbit32(weightTotal) + 1;
        if (tableLog > HUF_TABLELOG_MAX) return ERROR(corruption_detected);
        *tableLogPtr = tableLog;
        /* determine last weight */
        {   U32 const total = 1 << tableLog;
            U32 const rest = total - weightTotal;
            U32 const verif = 1 << BIT_highbit32(rest);
            U32 const lastWeight = BIT_highbit32(rest) + 1;
            if (verif != rest) return ERROR(corruption_detected);    /* last value must be a clean power of 2 */
            huffWeight[oSize] = (BYTE)lastWeight;
            rankStats[lastWeight]++;
    }   }

    /* check tree construction validity */
    if ((rankStats[1] < 2) || (rankStats[1] & 1)) return ERROR(corruption_detected);   /* by construction : at least 2 elts of rank 1, must be even */

    /* results */
    *nbSymbolsPtr = (U32)(oSize+1);
    return iSize+1;
}